

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_pretransfer(Curl_easy *data)

{
  CURLUcode CVar1;
  CURLcode CVar2;
  size_t sVar3;
  WildcardData *wc;
  CURLUcode uc;
  CURLcode result;
  Curl_easy *data_local;
  
  if (((data->change).url == (char *)0x0) && ((data->set).uh == (CURLU *)0x0)) {
    Curl_failf(data,"No URL set!");
    data_local._4_4_ = CURLE_URL_MALFORMAT;
  }
  else {
    if (((data->change).field_0x20 & 1) != 0) {
      (*Curl_cfree)((data->change).url);
      (data->change).url = (char *)0x0;
      (data->change).field_0x20 = (data->change).field_0x20 & 0xfe;
    }
    if ((((data->change).url == (char *)0x0) && ((data->set).uh != (CURLU *)0x0)) &&
       (CVar1 = curl_url_get((data->set).uh,CURLUPART_URL,(data->set).str + 0x19,0),
       CVar1 != CURLUE_OK)) {
      Curl_failf(data,"No URL set!");
      data_local._4_4_ = CURLE_URL_MALFORMAT;
    }
    else {
      (data->change).url = (data->set).str[0x19];
      wc._4_4_ = Curl_ssl_initsessions(data,(data->set).general_ssl.max_ssl_sessions);
      data_local._4_4_ = wc._4_4_;
      if (wc._4_4_ == CURLE_OK) {
        *(ushort *)&(data->state).field_0x4e4 =
             *(ushort *)&(data->state).field_0x4e4 & 0xff7f |
             ((ushort)(uint)((ulong)*(undefined8 *)&(data->set).field_0x888 >> 0x2a) & 1) << 7;
        (data->set).followlocation = 0;
        *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xfffd;
        *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xfff7;
        (data->state).httpversion = 0;
        *(ushort *)&(data->state).field_0x4e4 = *(ushort *)&(data->state).field_0x4e4 & 0xffdf;
        (data->state).authhost.want = (data->set).httpauth;
        (data->state).authproxy.want = (data->set).proxyauth;
        (*Curl_cfree)((data->info).wouldredirect);
        (data->info).wouldredirect = (char *)0x0;
        (data->info).wouldredirect = (char *)0x0;
        if ((data->set).httpreq == HTTPREQ_PUT) {
          (data->state).infilesize = (data->set).filesize;
        }
        else if (((data->set).httpreq == HTTPREQ_GET) || ((data->set).httpreq == HTTPREQ_HEAD)) {
          (data->state).infilesize = 0;
        }
        else {
          (data->state).infilesize = (data->set).postfieldsize;
          if (((data->set).postfields != (void *)0x0) && ((data->state).infilesize == -1)) {
            sVar3 = strlen((char *)(data->set).postfields);
            (data->state).infilesize = sVar3;
          }
        }
        if ((data->change).cookielist != (curl_slist *)0x0) {
          Curl_cookie_loadfiles(data);
        }
        if ((data->change).resolve != (curl_slist *)0x0) {
          wc._4_4_ = Curl_loadhostpairs(data);
        }
        if (wc._4_4_ == CURLE_OK) {
          *(ushort *)&(data->state).field_0x4e4 =
               *(ushort *)&(data->state).field_0x4e4 & 0xffef | 0x10;
          Curl_initinfo(data);
          Curl_pgrsResetTransferSizes(data);
          Curl_pgrsStartNow(data);
          (data->state).authhost.picked =
               (data->state).authhost.want & (data->state).authhost.picked;
          (data->state).authproxy.picked =
               (data->state).authproxy.want & (data->state).authproxy.picked;
          if (((*(ushort *)&(data->state).field_0x4e4 >> 7 & 1) != 0) &&
             ((data->wildcard).state == CURLWC_CLEAR)) {
            CVar2 = Curl_wildcard_init(&data->wildcard);
            if (CVar2 != CURLE_OK) {
              return CURLE_OUT_OF_MEMORY;
            }
            wc._4_4_ = CURLE_OK;
          }
        }
        data_local._4_4_ = wc._4_4_;
      }
    }
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_pretransfer(struct Curl_easy *data)
{
  CURLcode result;

  if(!data->change.url && !data->set.uh) {
    /* we can't do anything without URL */
    failf(data, "No URL set!");
    return CURLE_URL_MALFORMAT;
  }

  /* since the URL may have been redirected in a previous use of this handle */
  if(data->change.url_alloc) {
    /* the already set URL is allocated, free it first! */
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  if(!data->change.url && data->set.uh) {
    CURLUcode uc;
    uc = curl_url_get(data->set.uh,
                        CURLUPART_URL, &data->set.str[STRING_SET_URL], 0);
    if(uc) {
      failf(data, "No URL set!");
      return CURLE_URL_MALFORMAT;
    }
  }

  data->change.url = data->set.str[STRING_SET_URL];

  /* Init the SSL session ID cache here. We do it here since we want to do it
     after the *_setopt() calls (that could specify the size of the cache) but
     before any transfer takes place. */
  result = Curl_ssl_initsessions(data, data->set.general_ssl.max_ssl_sessions);
  if(result)
    return result;

  data->state.wildcardmatch = data->set.wildcard_enabled;
  data->set.followlocation = 0; /* reset the location-follow counter */
  data->state.this_is_a_follow = FALSE; /* reset this */
  data->state.errorbuf = FALSE; /* no error has occurred */
  data->state.httpversion = 0; /* don't assume any particular server version */

  data->state.authproblem = FALSE;
  data->state.authhost.want = data->set.httpauth;
  data->state.authproxy.want = data->set.proxyauth;
  Curl_safefree(data->info.wouldredirect);
  data->info.wouldredirect = NULL;

  if(data->set.httpreq == HTTPREQ_PUT)
    data->state.infilesize = data->set.filesize;
  else if((data->set.httpreq != HTTPREQ_GET) &&
          (data->set.httpreq != HTTPREQ_HEAD)) {
    data->state.infilesize = data->set.postfieldsize;
    if(data->set.postfields && (data->state.infilesize == -1))
      data->state.infilesize = (curl_off_t)strlen(data->set.postfields);
  }
  else
    data->state.infilesize = 0;

  /* If there is a list of cookie files to read, do it now! */
  if(data->change.cookielist)
    Curl_cookie_loadfiles(data);

  /* If there is a list of host pairs to deal with */
  if(data->change.resolve)
    result = Curl_loadhostpairs(data);

  if(!result) {
    /* Allow data->set.use_port to set which port to use. This needs to be
     * disabled for example when we follow Location: headers to URLs using
     * different ports! */
    data->state.allow_port = TRUE;

#if defined(HAVE_SIGNAL) && defined(SIGPIPE) && !defined(HAVE_MSG_NOSIGNAL)
    /*************************************************************
     * Tell signal handler to ignore SIGPIPE
     *************************************************************/
    if(!data->set.no_signal)
      data->state.prev_signal = signal(SIGPIPE, SIG_IGN);
#endif

    Curl_initinfo(data); /* reset session-specific information "variables" */
    Curl_pgrsResetTransferSizes(data);
    Curl_pgrsStartNow(data);

    /* In case the handle is re-used and an authentication method was picked
       in the session we need to make sure we only use the one(s) we now
       consider to be fine */
    data->state.authhost.picked &= data->state.authhost.want;
    data->state.authproxy.picked &= data->state.authproxy.want;

#ifndef CURL_DISABLE_FTP
    if(data->state.wildcardmatch) {
      struct WildcardData *wc = &data->wildcard;
      if(wc->state < CURLWC_INIT) {
        result = Curl_wildcard_init(wc); /* init wildcard structures */
        if(result)
          return CURLE_OUT_OF_MEMORY;
      }
    }
#endif
  }

  return result;
}